

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateConstructor
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,"private $classname$() {\n","classname",
                     *(string **)(this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  GenerateInitializers(this,printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::
GenerateConstructor(io::Printer* printer) {
  printer->Print(
      "private $classname$() {\n",
      "classname", descriptor_->name());
  printer->Indent();

  // Initialize all fields to default.
  GenerateInitializers(printer);

  printer->Outdent();
  printer->Print(
      "}\n");
}